

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O0

void __thiscall
duckdb::ARTMerger::Emplace
          (ARTMerger *this,Node *left,Node *right,GateStatus parent_status,idx_t depth)

{
  NType NVar1;
  NType NVar2;
  GateStatus GVar3;
  undefined1 in_CL;
  Node *in_RDX;
  Node *in_RSI;
  GateStatus *in_RDI;
  Node *in_R8;
  NType right_type;
  NType left_type;
  undefined4 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd5;
  undefined7 in_stack_ffffffffffffffe0;
  
  NVar1 = Node::GetType((Node *)0x18ca4a1);
  NVar2 = Node::GetType((Node *)0x18ca4af);
  if (NVar1 == LEAF_INLINED) {
    ::std::swap<duckdb::Node>(in_RSI,in_RDX);
  }
  else if ((NVar1 == PREFIX) && (NVar2 != LEAF_INLINED)) {
    ::std::swap<duckdb::Node>(in_RSI,in_RDX);
  }
  GVar3 = Node::GetGateStatus((Node *)CONCAT17(NVar1,CONCAT16(NVar2,CONCAT15(
                                                  in_stack_ffffffffffffffd5,
                                                  CONCAT14(in_stack_ffffffffffffffd4,
                                                           in_stack_ffffffffffffffd0)))));
  if (GVar3 == GATE_NOT_SET) {
    ::std::
    stack<duckdb::ARTMerger::NodeEntry,std::deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>>>
    ::emplace<duckdb::Node&,duckdb::Node&,duckdb::GateStatus_const&,unsigned_long_const&>
              ((stack<duckdb::ARTMerger::NodeEntry,_std::deque<duckdb::ARTMerger::NodeEntry,_std::allocator<duckdb::ARTMerger::NodeEntry>_>_>
                *)CONCAT17(in_CL,in_stack_ffffffffffffffe0),in_R8,
               (Node *)CONCAT17(NVar1,CONCAT16(NVar2,CONCAT15(in_stack_ffffffffffffffd5,
                                                              CONCAT14(in_stack_ffffffffffffffd4,
                                                                       in_stack_ffffffffffffffd0))))
               ,in_RDI,(unsigned_long *)0x18ca519);
  }
  else {
    ::std::
    stack<duckdb::ARTMerger::NodeEntry,std::deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>>>
    ::emplace<duckdb::Node&,duckdb::Node&,duckdb::GateStatus,int>
              ((stack<duckdb::ARTMerger::NodeEntry,_std::deque<duckdb::ARTMerger::NodeEntry,_std::allocator<duckdb::ARTMerger::NodeEntry>_>_>
                *)CONCAT17(in_CL,in_stack_ffffffffffffffe0),in_R8,
               (Node *)CONCAT17(NVar1,CONCAT16(NVar2,CONCAT15(1,(uint5)in_stack_ffffffffffffffd4 <<
                                                                0x20))),in_RDI,(int *)0x18ca549);
  }
  return;
}

Assistant:

void ARTMerger::Emplace(Node &left, Node &right, const GateStatus parent_status, const idx_t depth) {
	const auto left_type = left.GetType();
	const auto right_type = right.GetType();

	if (left_type == NType::LEAF_INLINED) {
		swap(left, right);
	} else if (left_type == NType::PREFIX && right_type != NType::LEAF_INLINED) {
		swap(left, right);
	}

	// left ONLY has GATE_SET, if it is the gate node.
	// When outside the gate, we propagate the parent_status (GATE_NOT_SET) and the depth.
	// When inside the gate, we already reset the depth, and we propagate the parent_status (GATE_SET).
	if (left.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		s.emplace(left, right, parent_status, depth);
		return;
	}

	// Enter a gate.
	// Reset the depth.
	D_ASSERT(parent_status == GateStatus::GATE_NOT_SET);
	s.emplace(left, right, GateStatus::GATE_SET, 0);
}